

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  TestCase *this_00;
  pointer type_param;
  GTestLog *pathname;
  char cwd [4097];
  String local_1048;
  GTestLog local_1038 [1026];
  
  pcVar2 = (this->original_working_dir_).pathname_.c_str_;
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    memset(local_1038,0,0x1001);
    pcVar2 = getcwd((char *)local_1038,0x1001);
    pathname = (GTestLog *)0x12aae3;
    if (pcVar2 != (char *)0x0) {
      pathname = local_1038;
    }
    FilePath::FilePath((FilePath *)&local_1048,(char *)pathname);
    String::operator=(&(this->original_working_dir_).pathname_,&local_1048);
    if (local_1048.c_str_ != (char *)0x0) {
      operator_delete__(local_1048.c_str_);
    }
    pcVar2 = (this->original_working_dir_).pathname_.c_str_;
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      GTestLog::GTestLog(local_1038,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-internal-inl.h"
                         ,0x285);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !original_working_dir_.IsEmpty() failed. ",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to get the current working directory.",0x2c);
      GTestLog::~GTestLog(local_1038);
    }
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    type_param = (char *)0x0;
  }
  else {
    type_param = (pbVar1->_M_dataplus)._M_p;
  }
  this_00 = GetTestCase(this,(test_info->test_case_name_)._M_dataplus._M_p,type_param,set_up_tc,
                        tear_down_tc);
  TestCase::AddTestInfo(this_00,test_info);
  return;
}

Assistant:

void AddTestInfo(Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc,
                   TestInfo* test_info) {
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_.Set(FilePath::GetCurrentDir());
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }

    GetTestCase(test_info->test_case_name(),
                test_info->type_param(),
                set_up_tc,
                tear_down_tc)->AddTestInfo(test_info);
  }